

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

void __thiscall
ON_FontGlyphCache::SetFontMetrics(ON_FontGlyphCache *this,ON_FontMetrics *font_unit_metrics)

{
  ON_FontMetrics *font_metrics;
  double dVar1;
  double dVar2;
  double dVar3;
  ON__UINT_PTR OVar4;
  int iVar5;
  int iVar6;
  ON__UINT16 OVar7;
  ON__UINT16 OVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ON_FontMetrics local_48;
  
  iVar12 = font_unit_metrics->m_UPM;
  iVar13 = font_unit_metrics->m_ascent;
  iVar14 = font_unit_metrics->m_descent;
  iVar15 = font_unit_metrics->m_line_space;
  OVar7 = font_unit_metrics->m_ascent_of_capital;
  OVar8 = font_unit_metrics->m_ascent_of_x;
  iVar9 = font_unit_metrics->m_strikeout_thickness;
  iVar10 = font_unit_metrics->m_strikeout_position;
  iVar11 = font_unit_metrics->m_underscore_thickness;
  iVar5 = font_unit_metrics->m_underscore_position;
  iVar6 = font_unit_metrics->m_reserved1;
  dVar1 = font_unit_metrics->m_reserved2;
  OVar4 = font_unit_metrics->m_reserved_ptr;
  (this->m_font_unit_metrics).m_reserved3 = font_unit_metrics->m_reserved3;
  (this->m_font_unit_metrics).m_reserved_ptr = OVar4;
  (this->m_font_unit_metrics).m_underscore_position = iVar5;
  (this->m_font_unit_metrics).m_reserved1 = iVar6;
  (this->m_font_unit_metrics).m_reserved2 = dVar1;
  (this->m_font_unit_metrics).m_ascent_of_capital = OVar7;
  (this->m_font_unit_metrics).m_ascent_of_x = OVar8;
  (this->m_font_unit_metrics).m_strikeout_thickness = iVar9;
  (this->m_font_unit_metrics).m_strikeout_position = iVar10;
  (this->m_font_unit_metrics).m_underscore_thickness = iVar11;
  (this->m_font_unit_metrics).m_UPM = iVar12;
  (this->m_font_unit_metrics).m_ascent = iVar13;
  (this->m_font_unit_metrics).m_descent = iVar14;
  (this->m_font_unit_metrics).m_line_space = iVar15;
  if (font_unit_metrics->m_UPM < 1) {
    this->m_normalized_to_font_unit_scale = 0.0;
    dVar1 = 0.0;
  }
  else {
    dVar2 = (double)font_unit_metrics->m_UPM;
    dVar3 = dVar2 * 0.00390625;
    this->m_normalized_to_font_unit_scale = dVar3;
    dVar1 = 0.0;
    if (0.0 < dVar3) {
      dVar1 = 256.0 / dVar2;
    }
  }
  font_metrics = &this->m_font_unit_metrics;
  this->m_font_unit_to_normalized_scale = dVar1;
  if ((dVar1 <= 0.0) || ((dVar1 == 1.0 && (!NAN(dVar1))))) {
    local_48.m_UPM = font_metrics->m_UPM;
    local_48.m_ascent = font_metrics->m_ascent;
    local_48.m_descent = (this->m_font_unit_metrics).m_descent;
    local_48.m_line_space = (this->m_font_unit_metrics).m_line_space;
    local_48.m_ascent_of_capital = (this->m_font_unit_metrics).m_ascent_of_capital;
    local_48.m_ascent_of_x = (this->m_font_unit_metrics).m_ascent_of_x;
    local_48.m_strikeout_thickness = (this->m_font_unit_metrics).m_strikeout_thickness;
    local_48.m_strikeout_position = (this->m_font_unit_metrics).m_strikeout_position;
    local_48.m_underscore_thickness = (this->m_font_unit_metrics).m_underscore_thickness;
    local_48.m_underscore_position = (this->m_font_unit_metrics).m_underscore_position;
    local_48.m_reserved1 = (this->m_font_unit_metrics).m_reserved1;
    local_48.m_reserved2 = (this->m_font_unit_metrics).m_reserved2;
    local_48.m_reserved3 = (this->m_font_unit_metrics).m_reserved3;
    local_48.m_reserved_ptr = (this->m_font_unit_metrics).m_reserved_ptr;
  }
  else {
    ON_FontMetrics::Scale(&local_48,font_metrics,dVar1);
  }
  (this->m_normalized_metrics).m_reserved3 = local_48.m_reserved3;
  (this->m_normalized_metrics).m_reserved_ptr = local_48.m_reserved_ptr;
  (this->m_normalized_metrics).m_underscore_position = local_48.m_underscore_position;
  (this->m_normalized_metrics).m_reserved1 = local_48.m_reserved1;
  (this->m_normalized_metrics).m_reserved2 = local_48.m_reserved2;
  (this->m_normalized_metrics).m_ascent_of_capital = local_48.m_ascent_of_capital;
  (this->m_normalized_metrics).m_ascent_of_x = local_48.m_ascent_of_x;
  (this->m_normalized_metrics).m_strikeout_thickness = local_48.m_strikeout_thickness;
  (this->m_normalized_metrics).m_strikeout_position = local_48.m_strikeout_position;
  (this->m_normalized_metrics).m_underscore_thickness = local_48.m_underscore_thickness;
  (this->m_normalized_metrics).m_UPM = local_48.m_UPM;
  (this->m_normalized_metrics).m_ascent = local_48.m_ascent;
  (this->m_normalized_metrics).m_descent = local_48.m_descent;
  (this->m_normalized_metrics).m_line_space = local_48.m_line_space;
  return;
}

Assistant:

void ON_FontGlyphCache::SetFontMetrics(
  const ON_FontMetrics& font_unit_metrics
)
{
  m_font_unit_metrics = font_unit_metrics;

  m_normalized_to_font_unit_scale 
    = font_unit_metrics.UPM() > 0
    ? (((double)font_unit_metrics.UPM()) / ((double)ON_Font::Constants::AnnotationFontCellHeight))
    : 0.0;
  m_font_unit_to_normalized_scale
    = m_normalized_to_font_unit_scale > 0.0
    ? (((double)ON_Font::Constants::AnnotationFontCellHeight) / ((double)font_unit_metrics.UPM()))
    : 0.0;

  m_normalized_metrics
    = (m_font_unit_to_normalized_scale > 0.0 && 1.0 != m_font_unit_to_normalized_scale)
    ? ON_FontMetrics::Scale(m_font_unit_metrics, m_font_unit_to_normalized_scale)
    : m_font_unit_metrics;
}